

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.hpp
# Opt level: O2

uint lcp_bitwise<unsigned_long>(unsigned_long x,unsigned_long y,uint k,uint bits_per_char)

{
  uint uVar1;
  
  if (x != y) {
    uVar1 = leading_zeros_64(y ^ x);
    k = ((uVar1 + k * bits_per_char) - 0x40) / bits_per_char;
  }
  return k;
}

Assistant:

unsigned int lcp_bitwise(T x, T y, unsigned int k, unsigned int bits_per_char) {
    if (x == y)
        return k;
    // XOR the two values and then find the MSB that isn't zero (since
    // the k-mer strings start (have first character) at MSB)
    T z = x ^ y;
    // get leading zeros (TODO: in bitops implement faster version for 32bit)
    unsigned int lz = leading_zeros(z);

    // get leading zeros in the k-mer representation
    unsigned int kmer_leading_zeros = lz - (sizeof(T)*8 - k*bits_per_char);
    unsigned int lcp = kmer_leading_zeros / bits_per_char;
    return lcp;
}